

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles3::Functional::eval_bitwiseAnd_uvec4(ShaderEvalContext *c)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  fVar1 = c->in[0].m_data[0];
  fVar2 = c->in[0].m_data[1];
  fVar3 = c->in[0].m_data[2];
  fVar4 = c->in[0].m_data[3];
  fVar5 = c->in[1].m_data[0];
  fVar6 = c->in[1].m_data[1];
  fVar7 = c->in[1].m_data[2];
  fVar8 = c->in[1].m_data[3];
  iVar12 = (int)fVar1;
  iVar14 = (int)fVar2;
  iVar16 = (int)fVar3;
  iVar18 = (int)fVar4;
  auVar9._0_4_ = (int)(fVar1 - 2.1474836e+09);
  auVar9._4_4_ = (int)(fVar2 - 2.1474836e+09);
  auVar9._8_4_ = (int)(fVar3 - 2.1474836e+09);
  auVar9._12_4_ = (int)(fVar4 - 2.1474836e+09);
  auVar20._0_4_ = iVar12 >> 0x1f;
  auVar20._4_4_ = iVar14 >> 0x1f;
  auVar20._8_4_ = iVar16 >> 0x1f;
  auVar20._12_4_ = iVar18 >> 0x1f;
  auVar21._4_4_ = iVar14;
  auVar21._0_4_ = iVar12;
  auVar21._8_4_ = iVar16;
  auVar21._12_4_ = iVar18;
  auVar21 = auVar20 & auVar9 | auVar21;
  auVar10._0_12_ = auVar21._4_12_;
  auVar10._12_4_ = auVar21._0_4_;
  uVar13 = (uint)fVar5;
  uVar15 = (uint)fVar6;
  uVar17 = (uint)fVar7;
  uVar19 = (uint)fVar8;
  auVar11._4_4_ = (int)uVar17 >> 0x1f & (int)(fVar7 - 2.1474836e+09) | uVar17;
  auVar11._0_4_ = (int)uVar19 >> 0x1f & (int)(fVar8 - 2.1474836e+09) | uVar19;
  auVar11._8_4_ = (int)uVar15 >> 0x1f & (int)(fVar6 - 2.1474836e+09) | uVar15;
  auVar11._12_4_ = (int)uVar13 >> 0x1f & (int)(fVar5 - 2.1474836e+09) | uVar13;
  auVar11 = auVar11 & auVar10;
  auVar21 = _DAT_01a1fbc0 & auVar11 | _DAT_01a607b0;
  (c->color).m_data[0] =
       ((float)(auVar11._0_4_ >> 0x10 | 0x53000000) - 5.497642e+11) + auVar21._0_4_;
  (c->color).m_data[1] =
       ((float)(auVar11._4_4_ >> 0x10 | 0x53000000) - 5.497642e+11) + auVar21._4_4_;
  (c->color).m_data[2] =
       ((float)(auVar11._8_4_ >> 0x10 | 0x53000000) - 5.497642e+11) + auVar21._8_4_;
  (c->color).m_data[3] =
       ((float)(auVar11._12_4_ >> 0x10 | 0x53000000) - 5.497642e+11) + auVar21._12_4_;
  return;
}

Assistant:

Vector<T, 4>			swizzle		(int a, int b, int c, int d) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); DE_ASSERT(d >= 0 && d < Size); return Vector<T, 4>(m_data[a], m_data[b], m_data[c], m_data[d]); }